

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket.cpp
# Opt level: O2

ssize_t __thiscall bucket::read(bucket *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  undefined4 in_register_00000034;
  char *pcVar2;
  int i;
  ulong uVar3;
  long lVar4;
  allocator_type local_41;
  _Vector_base<index,_std::allocator<index>_> local_40;
  
  pcVar2 = (char *)CONCAT44(in_register_00000034,__fd);
  lVar4 = 0;
  std::istream::seekg(pcVar2,0,0);
  std::istream::read(pcVar2,(long)this);
  std::istream::read(pcVar2,(long)&this->size);
  std::istream::read(pcVar2,(long)&this->depth);
  std::vector<index,_std::allocator<index>_>::vector
            ((vector<index,_std::allocator<index>_> *)&local_40,(ulong)this->size,&local_41);
  std::vector<index,_std::allocator<index>_>::_M_move_assign(&this->indices,&local_40);
  std::_Vector_base<index,_std::allocator<index>_>::~_Vector_base(&local_40);
  __buf_00 = extraout_RDX;
  for (uVar3 = 0; uVar1 = (ulong)this->size, uVar3 < uVar1; uVar3 = uVar3 + 1) {
    index::read((index *)((long)&((this->indices).super__Vector_base<index,_std::allocator<index>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->file_id + lVar4),__fd,
                __buf_00,__nbytes);
    lVar4 = lVar4 + 0xc;
    __buf_00 = extraout_RDX_00;
  }
  return uVar1;
}

Assistant:

void bucket::read(std::fstream &stream) {
    stream.seekg(0);

    stream.read((char *) &id, BUCKET_ID);
    stream.read((char *) &size, BUCKET_SIZE_FIELD);
    stream.read((char *) &depth, DEPTHS);

    indices = std::vector<index>(size);

    for (int i = 0; i < size; ++i) {
        indices[i].read(stream);
    }
}